

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_inspect(REF_CELL ref_cell)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  printf("ref_cell = %p\n",ref_cell);
  printf(" size_per = %d\n",(ulong)(uint)ref_cell->size_per);
  printf(" node_per = %d\n",(ulong)(uint)ref_cell->node_per);
  printf(" n = %d\n",(ulong)(uint)ref_cell->n);
  printf(" max = %d\n",(ulong)(uint)ref_cell->max);
  printf(" blank = %d\n",(ulong)(uint)ref_cell->blank);
  iVar1 = ref_cell->max;
  if (0 < iVar1) {
    uVar2 = 0;
    do {
      if (ref_cell->c2n[(long)(int)uVar2 * (long)ref_cell->size_per] != -1) {
        printf(" %d:",(ulong)uVar2);
        iVar1 = ref_cell->size_per;
        if (0 < iVar1) {
          lVar3 = 0;
          do {
            printf(" %d",(ulong)(uint)ref_cell->c2n[(int)(iVar1 * uVar2) + lVar3]);
            iVar1 = ref_cell->size_per;
            lVar3 = lVar3 + 1;
          } while ((int)lVar3 < iVar1);
        }
        putchar(10);
        iVar1 = ref_cell->max;
      }
      uVar2 = uVar2 + 1;
    } while ((int)uVar2 < iVar1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_inspect(REF_CELL ref_cell) {
  REF_INT cell, node;
  printf("ref_cell = %p\n", (void *)ref_cell);
  printf(" size_per = %d\n", ref_cell_size_per(ref_cell));
  printf(" node_per = %d\n", ref_cell_node_per(ref_cell));
  printf(" n = %d\n", ref_cell_n(ref_cell));
  printf(" max = %d\n", ref_cell_max(ref_cell));
  printf(" blank = %d\n", ref_cell->blank);
  for (cell = 0; cell < ref_cell_max(ref_cell); cell++) {
    if (ref_cell_valid(ref_cell, cell)) {
      printf(" %d:", cell);
      for (node = 0; node < ref_cell_size_per(ref_cell); node++)
        printf(" %d", ref_cell_c2n(ref_cell, node, cell));
      printf("\n");
    }
  }

  return REF_SUCCESS;
}